

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeDataNeededByPortableTransform
          (SequentialQuantizationAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  int iVar2;
  
  if (1 < ((this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.decoder_
          )->version_major_) {
    iVar2 = (*(this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
              _vptr_SequentialAttributeDecoder[0xd])(this);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  bVar1 = AttributeTransform::TransferToAttribute
                    (&(this->quantization_transform_).super_AttributeTransform,
                     (this->super_SequentialIntegerAttributeDecoder).
                     super_SequentialAttributeDecoder.portable_attribute_._M_t.
                     super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::
    DecodeDataNeededByPortableTransform(
        const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (decoder()->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 0)) {
    // Decode quantization data here only for files with bitstream version 2.0+
    if (!DecodeQuantizedDataInfo()) {
      return false;
    }
  }

  // Store the decoded transform data in portable attribute;
  return quantization_transform_.TransferToAttribute(portable_attribute());
}